

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsignalmapper.cpp
# Opt level: O0

void QSignalMapper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QObject *sender;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QSignalMapper *_t;
  QSignalMapper *in_stack_ffffffffffffffb0;
  
  if (in_ESI == 0) {
    sender = (QObject *)(ulong)in_EDX;
    switch(sender) {
    case (QObject *)0x0:
      mappedInt((QSignalMapper *)0x41da37,0);
      break;
    case (QObject *)0x1:
      mappedString(in_stack_ffffffffffffffb0,(QString *)sender);
      break;
    case (QObject *)0x2:
      mappedObject((QSignalMapper *)0x41da64,sender);
      break;
    case (QObject *)0x3:
      map(in_stack_ffffffffffffffb0);
      break;
    case (QObject *)0x4:
      map(in_stack_ffffffffffffffb0,sender);
    }
  }
  if (((in_ESI == 5) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QSignalMapper::*)(int)>
                         (in_RCX,(void **)mappedInt,0,0), !bVar1)) &&
     (bVar1 = QtMocHelpers::indexOfMethod<void(QSignalMapper::*)(QString_const&)>
                        (in_RCX,(void **)mappedString,0,1), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QSignalMapper::*)(QObject*)>(in_RCX,(void **)mappedObject,0,2);
  }
  return;
}

Assistant:

void QSignalMapper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSignalMapper *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->mappedInt((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->mappedString((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->mappedObject((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        case 3: _t->map(); break;
        case 4: _t->map((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSignalMapper::*)(int )>(_a, &QSignalMapper::mappedInt, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSignalMapper::*)(const QString & )>(_a, &QSignalMapper::mappedString, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSignalMapper::*)(QObject * )>(_a, &QSignalMapper::mappedObject, 2))
            return;
    }
}